

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

Result __thiscall
anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::operator()
          (QFactoryLoaderIidSearch *this,QtPluginMetaDataKeys key,QCborStreamReader *reader)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (key != IID) {
    skip(reader);
  }
  else {
    QCborStreamReader::readAllString((QString *)&local_30,(QCborStreamReader *)reader);
    bVar1 = ::operator==((QString *)&local_30,&this->iid);
    this->matchesIid = bVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (uint)(key != IID);
  }
  __stack_chk_fail();
}

Assistant:

IterationResult::Result operator()(QtPluginMetaDataKeys key, QCborStreamReader &reader)
    {
        if (key != QtPluginMetaDataKeys::IID)
            return skip(reader);
        matchesIid = (reader.readAllString() == iid);
        return IterationResult::FinishedSearch;
    }